

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_fast
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  unique_color *puVar7;
  byte *pbVar8;
  uchar *puVar9;
  int iVar10;
  bool bVar11;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_f8;
  uint local_dc;
  uint i;
  uint s;
  uint best_error_1;
  uint8 best_color_index_1;
  int dot_1;
  color_quad_u8 *c_1;
  int unique_color_index_1;
  int c21Point;
  int c02Point;
  uint best_error;
  uint8 best_color_index;
  int dot;
  color_quad_u8 *c;
  int unique_color_index;
  int c3Point;
  int halfPoint;
  int c0Point;
  uint64 trial_error;
  uint block_type;
  int dirb;
  int dirg;
  int dirr;
  int stops [4];
  int local_58;
  int vb;
  int vg;
  int vr;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_48;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_44;
  color_quad_u8 colors [4];
  uint local_2c;
  uint local_28;
  uint last_block_type;
  uint first_block_type;
  bool alternate_rounding_local;
  dxt1_solution_coordinates *coords_local;
  dxt1_endpoint_optimizer *this_local;
  
  (this->m_trial_solution).m_coords = *coords;
  uVar1 = vector<crnlib::unique_color>::size(&this->m_unique_colors);
  vector<unsigned_char>::resize(&(this->m_trial_solution).m_selectors,uVar1,false);
  (this->m_trial_solution).m_error = (this->m_best_solution).m_error;
  (this->m_trial_solution).m_alpha_block = false;
  local_28 = 0;
  local_2c = 1;
  if (((this->m_pParams->m_pixels_have_alpha & 1U) == 0) &&
     ((this->m_pParams->m_force_alpha_blocks & 1U) == 0)) {
    local_2c = (uint)((this->m_pParams->m_use_alpha_blocks & 1U) != 0);
  }
  else {
    local_28 = 1;
  }
  uVar1 = vector<crnlib::unique_color>::size(&this->m_unique_colors);
  vector<unsigned_char>::resize(&this->m_trial_selectors,uVar1,false);
  local_f8 = &local_48;
  do {
    color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&local_f8->field_0)
    ;
    local_f8 = local_f8 + 1;
  } while (local_f8 != &colors[2].field_0);
  dxt1_block::unpack_color((dxt1_block *)&vr,coords->m_low_color,true,0xff);
  color_quad<unsigned_char,_int>::operator=
            ((color_quad<unsigned_char,_int> *)&local_48.field_0,
             (color_quad<unsigned_char,_int> *)&vr);
  dxt1_block::unpack_color((dxt1_block *)&vg,coords->m_high_color,true,0xff);
  color_quad<unsigned_char,_int>::operator=
            ((color_quad<unsigned_char,_int> *)&local_44.field_0,
             (color_quad<unsigned_char,_int> *)&vg);
  vb = (uint)local_44.field_0.r - (uint)local_48.field_0.r;
  local_58 = (uint)local_44.field_0.g - (uint)local_48.field_0.g;
  iVar10 = (uint)local_44.field_0.b - (uint)local_48.field_0.b;
  if ((this->m_perceptual & 1U) != 0) {
    vb = vb * 8;
    local_58 = local_58 * 0x18;
  }
  iVar2 = (uint)local_48.field_0.r * vb + (uint)local_48.field_0.g * local_58 +
          (uint)local_48.field_0.b * iVar10;
  iVar3 = (uint)local_44.field_0.r * vb + (uint)local_44.field_0.g * local_58 +
          (uint)local_44.field_0.b * iVar10;
  trial_error._0_4_ = local_28;
  do {
    if (local_2c < (uint)trial_error) {
      if ((((this->m_trial_solution).m_alpha_block & 1U) == 0) &&
         ((this->m_trial_solution).m_coords.m_low_color ==
          (this->m_trial_solution).m_coords.m_high_color)) {
        bVar11 = ((this->m_trial_solution).m_coords.m_low_color & 0x1f) == 0x1f;
        if (bVar11) {
          (this->m_trial_solution).m_coords.m_high_color =
               (this->m_trial_solution).m_coords.m_high_color - 1;
        }
        else {
          (this->m_trial_solution).m_coords.m_low_color =
               (this->m_trial_solution).m_coords.m_low_color + 1;
        }
        for (local_dc = 0; uVar1 = vector<crnlib::unique_color>::size(&this->m_unique_colors),
            local_dc < uVar1; local_dc = local_dc + 1) {
          puVar9 = vector<unsigned_char>::operator[](&(this->m_trial_solution).m_selectors,local_dc)
          ;
          *puVar9 = !bVar11;
        }
      }
      bVar11 = (this->m_trial_solution).m_error < (this->m_best_solution).m_error;
      if (bVar11) {
        potential_solution::operator=(&this->m_best_solution,&this->m_trial_solution);
      }
      return bVar11;
    }
    _halfPoint = 0;
    if ((uint)trial_error == 0) {
      color_quad<unsigned_char,_int>::set_noclamp_rgba
                (colors,((uint)local_48.field_0.r * 2 + (uint)local_44.field_0.r +
                        (uint)alternate_rounding) / 3,
                 ((uint)local_48.field_0.g * 2 + (uint)local_44.field_0.g + (uint)alternate_rounding
                 ) / 3,((uint)local_48.field_0.b * 2 + (uint)local_44.field_0.b +
                       (uint)alternate_rounding) / 3,0xff);
      color_quad<unsigned_char,_int>::set_noclamp_rgba
                (colors + 1,
                 ((uint)local_44.field_0.r * 2 + (uint)local_48.field_0.r + (uint)alternate_rounding
                 ) / 3,((uint)local_44.field_0.g * 2 + (uint)local_48.field_0.g +
                       (uint)alternate_rounding) / 3,
                 ((uint)local_44.field_0.b * 2 + (uint)local_48.field_0.b + (uint)alternate_rounding
                 ) / 3,0xff);
      iVar4 = (uint)(byte)colors[0].field_0._0_1_ * vb +
              (uint)(byte)colors[0].field_0._1_1_ * local_58 +
              (uint)(byte)colors[0].field_0._2_1_ * iVar10;
      iVar5 = (uint)(byte)colors[1].field_0._0_1_ * vb +
              (uint)(byte)colors[1].field_0._1_1_ * local_58 +
              (uint)(byte)colors[1].field_0._2_1_ * iVar10;
      c._0_4_ = vector<crnlib::unique_color>::size(&this->m_unique_colors);
      while (c._0_4_ = (uint)c - 1, -1 < (int)(uint)c) {
        puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,(uint)c);
        iVar6 = (uint)(puVar7->m_color).field_0.field_0.r * vb * 2 +
                (uint)(puVar7->m_color).field_0.field_0.g * local_58 * 2 +
                (uint)(puVar7->m_color).field_0.field_0.b * iVar10 * 2;
        if (iVar6 < iVar5 + iVar4) {
          c02Point._3_1_ = 2;
          if (iVar6 < iVar4 + iVar2) {
            c02Point._3_1_ = 0;
          }
        }
        else {
          c02Point._3_1_ = 1;
          if (iVar6 < iVar3 + iVar5) {
            c02Point._3_1_ = 3;
          }
        }
        uVar1 = color_distance(this,(bool)(this->m_perceptual & 1),&puVar7->m_color,
                               (color_quad_u8 *)&(&local_48)[c02Point._3_1_].field_0,false);
        puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,(uint)c);
        _halfPoint = (ulong)uVar1 * (ulong)puVar7->m_weight + _halfPoint;
        if ((this->m_trial_solution).m_error <= _halfPoint) break;
        pbVar8 = vector<unsigned_char>::operator[](&this->m_trial_selectors,(uint)c);
        *pbVar8 = c02Point._3_1_;
      }
    }
    else {
      color_quad<unsigned_char,_int>::set_noclamp_rgba
                (colors,(int)((uint)local_48.field_0.r + (uint)local_44.field_0.r +
                             (uint)alternate_rounding) >> 1,
                 (int)((uint)local_48.field_0.g + (uint)local_44.field_0.g +
                      (uint)alternate_rounding) >> 1,
                 (int)((uint)local_48.field_0.b + (uint)local_44.field_0.b +
                      (uint)alternate_rounding) >> 1,0xff);
      iVar4 = (uint)(byte)colors[0].field_0._0_1_ * vb +
              (uint)(byte)colors[0].field_0._1_1_ * local_58 +
              (uint)(byte)colors[0].field_0._2_1_ * iVar10;
      c_1._0_4_ = vector<crnlib::unique_color>::size(&this->m_unique_colors);
      while (c_1._0_4_ = (uint)c_1 - 1, -1 < (int)(uint)c_1) {
        puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,(uint)c_1);
        iVar5 = (uint)(puVar7->m_color).field_0.field_0.r * vb * 2 +
                (uint)(puVar7->m_color).field_0.field_0.g * local_58 * 2 +
                (uint)(puVar7->m_color).field_0.field_0.b * iVar10 * 2;
        if (iVar5 < iVar2 + iVar4) {
          s._3_1_ = 0;
        }
        else if (iVar5 < iVar4 + iVar3) {
          s._3_1_ = 2;
        }
        else {
          s._3_1_ = 1;
        }
        uVar1 = color_distance(this,(bool)(this->m_perceptual & 1),&puVar7->m_color,
                               (color_quad_u8 *)&(&local_48)[s._3_1_].field_0,false);
        puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,(uint)c_1);
        _halfPoint = (ulong)uVar1 * (ulong)puVar7->m_weight + _halfPoint;
        if ((this->m_trial_solution).m_error <= _halfPoint) break;
        pbVar8 = vector<unsigned_char>::operator[](&this->m_trial_selectors,(uint)c_1);
        *pbVar8 = s._3_1_;
      }
    }
    if (_halfPoint < (this->m_trial_solution).m_error) {
      (this->m_trial_solution).m_error = _halfPoint;
      (this->m_trial_solution).m_alpha_block = (uint)trial_error != 0;
      vector<unsigned_char>::operator=
                (&(this->m_trial_solution).m_selectors,&this->m_trial_selectors);
    }
    trial_error._0_4_ = (uint)trial_error + 1;
  } while( true );
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_fast(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        m_trial_solution.m_coords = coords;
        m_trial_solution.m_selectors.resize(m_unique_colors.size());
        m_trial_solution.m_error = m_best_solution.m_error;
        m_trial_solution.m_alpha_block = false;

        uint first_block_type = 0;
        uint last_block_type = 1;

        if ((m_pParams->m_pixels_have_alpha) || (m_pParams->m_force_alpha_blocks))
        {
            first_block_type = 1;
        }
        else if (!m_pParams->m_use_alpha_blocks)
        {
            last_block_type = 0;
        }

        m_trial_selectors.resize(m_unique_colors.size());

        color_quad_u8 colors[cDXT1SelectorValues];
        colors[0] = dxt1_block::unpack_color(coords.m_low_color, true);
        colors[1] = dxt1_block::unpack_color(coords.m_high_color, true);

        int vr = colors[1].r - colors[0].r;
        int vg = colors[1].g - colors[0].g;
        int vb = colors[1].b - colors[0].b;
        if (m_perceptual)
        {
            vr *= 8;
            vg *= 24;
        }

        int stops[4];
        stops[0] = colors[0].r * vr + colors[0].g * vg + colors[0].b * vb;
        stops[1] = colors[1].r * vr + colors[1].g * vg + colors[1].b * vb;

        int dirr = vr * 2;
        int dirg = vg * 2;
        int dirb = vb * 2;

        for (uint block_type = first_block_type; block_type <= last_block_type; block_type++)
        {
            uint64 trial_error = 0;

            if (!block_type)
            {
                colors[2].set_noclamp_rgba((colors[0].r * 2 + colors[1].r + alternate_rounding) / 3, (colors[0].g * 2 + colors[1].g + alternate_rounding) / 3, (colors[0].b * 2 + colors[1].b + alternate_rounding) / 3, 255U);
                colors[3].set_noclamp_rgba((colors[1].r * 2 + colors[0].r + alternate_rounding) / 3, (colors[1].g * 2 + colors[0].g + alternate_rounding) / 3, (colors[1].b * 2 + colors[0].b + alternate_rounding) / 3, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;
                stops[3] = colors[3].r * vr + colors[3].g * vg + colors[3].b * vb;

                // 0 2 3 1
                int c0Point = stops[1] + stops[3];
                int halfPoint = stops[3] + stops[2];
                int c3Point = stops[2] + stops[0];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot >= halfPoint)
                    {
                        best_color_index = (dot < c0Point) ? 3 : 1;
                    }
                    else
                    {
                        best_color_index = (dot < c3Point) ? 0 : 2;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }
            else
            {
                colors[2].set_noclamp_rgba((colors[0].r + colors[1].r + alternate_rounding) >> 1, (colors[0].g + colors[1].g + alternate_rounding) >> 1, (colors[0].b + colors[1].b + alternate_rounding) >> 1, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;

                // 0 2 1
                int c02Point = stops[0] + stops[2];
                int c21Point = stops[2] + stops[1];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot < c02Point)
                    {
                        best_color_index = 0;
                    }
                    else if (dot < c21Point)
                    {
                        best_color_index = 2;
                    }
                    else
                    {
                        best_color_index = 1;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }

            if (trial_error < m_trial_solution.m_error)
            {
                m_trial_solution.m_error = trial_error;
                m_trial_solution.m_alpha_block = (block_type != 0);
                m_trial_solution.m_selectors = m_trial_selectors;
            }
        }

        if ((!m_trial_solution.m_alpha_block) && (m_trial_solution.m_coords.m_low_color == m_trial_solution.m_coords.m_high_color))
        {
            uint s;
            if ((m_trial_solution.m_coords.m_low_color & 31) != 31)
            {
                m_trial_solution.m_coords.m_low_color++;
                s = 1;
            }
            else
            {
                m_trial_solution.m_coords.m_high_color--;
                s = 0;
            }

            for (uint i = 0; i < m_unique_colors.size(); i++)
            {
                m_trial_solution.m_selectors[i] = static_cast<uint8>(s);
            }
        }

        if (m_trial_solution.m_error < m_best_solution.m_error)
        {
            m_best_solution = m_trial_solution;
            return true;
        }

        return false;
    }